

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VkBootstrap.cpp
# Opt level: O0

VkResult vkb::detail::
         get_vector<VkPhysicalDevice_T*,VkResult(*&)(VkInstance_T*,unsigned_int*,VkPhysicalDevice_T**),VkInstance_T*const&>
                   (vector<VkPhysicalDevice_T_*,_std::allocator<VkPhysicalDevice_T_*>_> *out,
                   _func_VkResult_VkInstance_T_ptr_uint_ptr_VkPhysicalDevice_T_ptr_ptr **f,
                   VkInstance_T **ts)

{
  VkInstance_T *pVVar1;
  VkInstance_T *pVVar2;
  VkResult VVar3;
  VkPhysicalDevice_T **ppVVar4;
  uint local_2c;
  VkResult err;
  uint32_t count;
  VkInstance_T **ts_local;
  _func_VkResult_VkInstance_T_ptr_uint_ptr_VkPhysicalDevice_T_ptr_ptr **f_local;
  vector<VkPhysicalDevice_T_*,_std::allocator<VkPhysicalDevice_T_*>_> *out_local;
  
  local_2c = 0;
  _err = ts;
  ts_local = (VkInstance_T **)f;
  f_local = (_func_VkResult_VkInstance_T_ptr_uint_ptr_VkPhysicalDevice_T_ptr_ptr **)out;
  do {
    VVar3 = (*(code *)*ts_local)(*_err,&local_2c,0);
    if (VVar3 != VK_SUCCESS) {
      return VVar3;
    }
    std::vector<VkPhysicalDevice_T_*,_std::allocator<VkPhysicalDevice_T_*>_>::resize
              ((vector<VkPhysicalDevice_T_*,_std::allocator<VkPhysicalDevice_T_*>_> *)f_local,
               (ulong)local_2c);
    pVVar1 = *ts_local;
    pVVar2 = *_err;
    ppVVar4 = std::vector<VkPhysicalDevice_T_*,_std::allocator<VkPhysicalDevice_T_*>_>::data
                        ((vector<VkPhysicalDevice_T_*,_std::allocator<VkPhysicalDevice_T_*>_> *)
                         f_local);
    VVar3 = (*(code *)pVVar1)(pVVar2,&local_2c,ppVVar4);
    std::vector<VkPhysicalDevice_T_*,_std::allocator<VkPhysicalDevice_T_*>_>::resize
              ((vector<VkPhysicalDevice_T_*,_std::allocator<VkPhysicalDevice_T_*>_> *)f_local,
               (ulong)local_2c);
  } while (VVar3 == VK_INCOMPLETE);
  return VVar3;
}

Assistant:

auto get_vector(std::vector<T>& out, F&& f, Ts&&... ts) -> VkResult {
    uint32_t count = 0;
    VkResult err;
    do {
        err = f(ts..., &count, nullptr);
        if (err != VK_SUCCESS) {
            return err;
        };
        out.resize(count);
        err = f(ts..., &count, out.data());
        out.resize(count);
    } while (err == VK_INCOMPLETE);
    return err;
}